

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

int nni_id_remove(nni_id_map *m,uint64_t id)

{
  nni_id_entry *pnVar1;
  nni_id_entry *pnVar2;
  nni_id_entry *entry;
  size_t probe;
  size_t index;
  uint64_t id_local;
  nni_id_map *m_local;
  
  pnVar1 = (nni_id_entry *)id_find(m,id);
  if (pnVar1 == (nni_id_entry *)0xffffffffffffffff) {
    m_local._4_4_ = 0xc;
  }
  else {
    entry = (nni_id_entry *)(id & m->id_cap - 1);
    while( true ) {
      m->id_load = m->id_load - 1;
      pnVar2 = m->id_entries + (long)entry;
      if (entry == pnVar1) break;
      if (pnVar2->skips == 0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c"
                  ,0x107,"entry->skips > 0");
      }
      pnVar2->skips = pnVar2->skips - 1;
      entry = (nni_id_entry *)((long)entry * 5 + 1U & (ulong)(m->id_cap - 1));
    }
    pnVar2->val = (void *)0x0;
    pnVar2->key = 0;
    m->id_count = m->id_count - 1;
    id_resize(m);
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int
nni_id_remove(nni_id_map *m, uint64_t id)
{
	size_t index;
	size_t probe;

	if ((index = id_find(m, id)) == (size_t) -1) {
		return (NNG_ENOENT);
	}

	// Now we have found the index where the object exists.  We are going
	// to restart the search, until the index matches, to decrement the
	// skips counter.
	probe = ID_INDEX(m, id);

	for (;;) {
		nni_id_entry *entry;

		// The load was increased once each hashing operation we used
		// to place the item.  Decrement it accordingly.
		m->id_load--;
		entry = &m->id_entries[probe];
		if (probe == index) {
			entry->val = NULL;
			entry->key = 0; // invalid key
			break;
		}
		NNI_ASSERT(entry->skips > 0);
		entry->skips--;
		probe = ID_NEXT(m, probe);
	}

	m->id_count--;

	// Shrink -- but it's ok if we can't.
	(void) id_resize(m);

	return (0);
}